

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::ExactCompareLineDistance(Vector3_xf *x,Vector3_xf *a0,Vector3_xf *a1,ExactFloat *r2)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  ExactFloat cmp;
  ExactFloat sin2_r;
  ExactFloat sin_d;
  Vector3_xf n;
  ExactFloat local_e0;
  ExactFloat local_d0;
  ExactFloat local_c0;
  ExactFloat local_b0;
  BasicVector<Vector3,_ExactFloat,_3UL> local_a0 [8];
  BIGNUM *local_98;
  BasicVector<Vector3,_ExactFloat,_3UL> local_90 [8];
  BIGNUM *local_88;
  ExactFloat local_80;
  ExactFloat local_70;
  Vector3<ExactFloat> local_60;
  
  ExactFloat::ExactFloat(local_60.c_,2.0);
  bVar1 = false;
  if ((local_60.c_[0].bn_exp_ != 0x7fffffff) && (bVar1 = false, r2->bn_exp_ != 0x7fffffff)) {
    bVar1 = operator<(r2,local_60.c_);
    bVar1 = !bVar1;
  }
  BN_free((BIGNUM *)local_60.c_[0].bn_.bn_);
  iVar3 = -1;
  if (!bVar1) {
    Vector3<ExactFloat>::CrossProd(&local_60,a0,a1);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_70,x);
    ExactFloat::ExactFloat(&local_c0,1);
    ExactFloat::ExactFloat(&local_e0,0.25);
    operator*(&local_d0,&local_e0);
    operator-(&local_b0,&local_c0);
    operator*(&local_80,r2);
    BN_free((BIGNUM *)local_b0.bn_.bn_);
    BN_free((BIGNUM *)local_d0.bn_.bn_);
    BN_free((BIGNUM *)local_e0.bn_.bn_);
    BN_free((BIGNUM *)local_c0.bn_.bn_);
    operator*(&local_c0,&local_70);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd(local_90,x);
    operator*(&local_e0,&local_80);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd(local_a0,&local_60);
    operator*(&local_d0,&local_e0);
    operator-(&local_b0,&local_c0);
    BN_free((BIGNUM *)local_d0.bn_.bn_);
    BN_free(local_98);
    BN_free((BIGNUM *)local_e0.bn_.bn_);
    BN_free(local_88);
    BN_free((BIGNUM *)local_c0.bn_.bn_);
    iVar3 = 0;
    if ((local_b0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
      iVar3 = local_b0.sign_;
    }
    BN_free((BIGNUM *)local_b0.bn_.bn_);
    BN_free((BIGNUM *)local_80.bn_.bn_);
    BN_free((BIGNUM *)local_70.bn_.bn_);
    lVar2 = 0x30;
    do {
      BN_free(*(BIGNUM **)((long)local_60.c_ + lVar2 + -8));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != 0);
  }
  return iVar3;
}

Assistant:

int ExactCompareLineDistance(const Vector3_xf& x, const Vector3_xf& a0,
                             const Vector3_xf& a1, const ExactFloat& r2) {
  // Since we are given that the closest point is in the edge interior, the
  // true distance is always less than 90 degrees (which corresponds to a
  // squared chord length of 2.0).
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise compute the edge normal
  Vector3_xf n = a0.CrossProd(a1);
  ExactFloat sin_d = x.DotProd(n);
  ExactFloat sin2_r = r2 * (1 - 0.25 * r2);
  ExactFloat cmp = sin_d * sin_d - sin2_r * x.Norm2() * n.Norm2();
  return cmp.sgn();
}